

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  LogFinisher local_59;
  LogMessage local_58;
  
  pVar6 = Insert(this,number);
  pEVar2 = pVar6.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated == false) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x265);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_59,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    CVar1 = anon_unknown_26::cpp_type(pEVar2->type);
    if (CVar1 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x265);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_59,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
  }
  else {
    pEVar2->type = type;
    CVar1 = anon_unknown_26::cpp_type(type);
    if (CVar1 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x25f);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_59,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    pEVar2->is_repeated = true;
    pEVar2->is_packed = false;
    pRVar4 = Arena::CreateMessageInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                       (this->arena_);
    (pEVar2->field_0).repeated_string_value = pRVar4;
  }
  pbVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((pEVar2->field_0).repeated_string_value);
  return pbVar5;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}